

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O3

QDataStream * operator<<(QDataStream *stream,QCborMap *value)

{
  long in_FS_OFFSET;
  QByteArray local_48;
  QCborValue local_30 [8];
  QCborContainerPrivate *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborValue::QCborValue(local_30,value);
  QCborValue::toCbor(&local_48,local_30,(EncodingOptions)0x0);
  operator<<(stream,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_28 != (QCborContainerPrivate *)0x0) {
    QCborContainerPrivate::deref(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &stream, const QCborMap &value)
{
    stream << value.toCborValue().toCbor();
    return stream;
}